

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

PyObject * pybind11::cpp_function::dispatcher(PyObject *self,PyObject *args_in,PyObject *kwargs_in)

{
  uint __val;
  pointer paVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  handle hVar4;
  _Bit_pointer puVar5;
  PyTypeObject **ppPVar6;
  bool bVar7;
  argument_record aVar8;
  uint uVar9;
  int iVar10;
  function_record *pfVar11;
  long lVar12;
  handle hVar13;
  type_info *ptVar14;
  undefined8 *puVar15;
  long *plVar16;
  long lVar17;
  function_record *pfVar18;
  function_record *pfVar19;
  object *poVar20;
  error_already_set *this;
  byte bVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  size_type __new_size;
  uint __len;
  iterator __begin3;
  function_record *pfVar25;
  uint __uval;
  uint uVar26;
  pointer paVar27;
  bool bVar28;
  handle arg;
  tuple extra_args;
  vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  second_pass;
  string msg;
  dict kwargs;
  undefined1 local_188 [24];
  object oStack_170;
  _Bit_pointer local_168;
  handle local_160;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  _Bit_pointer local_138;
  undefined1 local_128 [32];
  undefined1 local_108 [8];
  undefined1 local_100 [16];
  handle *local_f0;
  undefined1 auStack_e8 [16];
  handle local_d8;
  handle hStack_d0;
  _Bit_pointer local_c8;
  handle local_c0;
  ulong local_b8;
  handle local_b0;
  long local_a8;
  PyObject local_a0;
  function_record *local_90;
  function_record *local_88;
  function_record *local_80;
  function_record *local_78;
  ulong local_70;
  PyObject *local_60;
  PyTypeObject *local_58;
  function_record *local_50;
  PyTypeObject **local_48;
  handle local_40;
  object local_38;
  
  pfVar11 = (function_record *)PyCapsule_GetPointer(self,0);
  if ((args_in->ob_type->tp_flags & 0x4000000) == 0) {
    __assert_fail("PyTuple_Check(args_in)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/shibasisp[P]pybind11-examples/pybind11/include/pybind11/pybind11.h"
                  ,0x1a0,
                  "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                 );
  }
  uVar22 = args_in[1].ob_refcnt;
  if (uVar22 == 0) {
    local_58 = (PyTypeObject *)0x0;
  }
  else {
    local_58 = args_in[1].ob_type;
  }
  local_128._0_8_ = (PyObject *)0x0;
  local_128._8_8_ = (function_record *)0x0;
  local_128._16_8_ = (pointer)0x0;
  local_90 = pfVar11;
  local_80 = (function_record *)args_in;
  local_78 = (function_record *)kwargs_in;
  local_70 = uVar22;
  if (pfVar11 != (function_record *)0x0) {
    local_50 = pfVar11->next;
    local_48 = &args_in[1].ob_type;
    local_60 = (PyObject *)0x1;
    do {
      bVar21 = (pfVar11->field_0x59 & 8) >> 3;
      uVar24 = (long)((char)(pfVar11->field_0x59 << 3) >> 7) +
               ((ulong)pfVar11->nargs - (ulong)bVar21);
      if (((bVar21 != 0) || (uVar22 <= uVar24)) &&
         ((uVar24 <= uVar22 ||
          (uVar24 <= (ulong)((long)(pfVar11->args).
                                   super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pfVar11->args).
                                   super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5))))) {
        local_d8.m_ptr = (PyObject *)0x0;
        hStack_d0.m_ptr = hStack_d0.m_ptr & 0xffffffff00000000;
        local_c8 = (_Bit_pointer)0x0;
        auStack_e8._8_8_ = auStack_e8._8_8_ & 0xffffffff00000000;
        local_f0 = (handle *)0x0;
        auStack_e8._0_8_ = (function_record *)0x0;
        local_100._0_8_ = (pointer)0x0;
        local_100._8_8_ = (handle *)0x0;
        local_c0.m_ptr = (PyObject *)local_58;
        local_108 = (undefined1  [8])pfVar11;
        std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::reserve
                  ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)local_100,
                   (ulong)pfVar11->nargs);
        std::vector<bool,_std::allocator<bool>_>::reserve
                  ((vector<bool,_std::allocator<bool>_> *)auStack_e8,(ulong)pfVar11->nargs);
        local_b8 = uVar24;
        if (uVar22 < uVar24) {
          local_b8 = uVar22;
        }
        local_88 = pfVar11;
        if (local_b8 != 0) {
          lVar17 = 0;
          uVar22 = 0;
          do {
            paVar1 = (local_88->args).
                     super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (uVar22 < (ulong)((long)(local_88->args).
                                       super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)paVar1 >>
                                5)) {
              paVar27 = paVar1 + lVar17;
              bVar28 = paVar1 != (pointer)0x0;
              if ((((local_78 != (function_record *)0x0) && (paVar1 != (pointer)0x0)) &&
                  (bVar28 = true, *(long *)paVar27 != 0)) &&
                 (lVar12 = PyDict_GetItemString(local_78), lVar12 != 0)) {
LAB_00116059:
                bVar28 = false;
                pfVar11 = local_88;
                goto LAB_00116369;
              }
              if ((((PyTypeObject *)
                   (((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)&local_80->doc)
                   ->super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>).
                   _M_impl.super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0)
              goto LAB_00116d9a;
              local_188._0_8_ =
                   (&(local_80->args).
                     super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                     ._M_impl.super__Vector_impl_data._M_start)[uVar22];
              if (bVar28) {
                bVar28 = true;
                if ((((byte)paVar1[lVar17 + 0x18] & 2) == 0) &&
                   (bVar28 = true,
                   (function_record *)local_188._0_8_ == (function_record *)&_Py_NoneStruct))
                goto LAB_00116059;
              }
              else {
                bVar28 = false;
              }
            }
            else {
              if ((((PyTypeObject *)
                   (((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)&local_80->doc)
                   ->super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>).
                   _M_impl.super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
LAB_00116d9a:
                __assert_fail("PyTuple_Check(args_in)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/shibasisp[P]pybind11-examples/pybind11/include/pybind11/pybind11.h"
                              ,0x1dd,
                              "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                             );
              }
              local_188._0_8_ =
                   (&(local_80->args).
                     super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                     ._M_impl.super__Vector_impl_data._M_start)[uVar22];
              bVar28 = false;
              paVar27 = (pointer)0x0;
            }
            if ((handle *)local_100._8_8_ == local_f0) {
              std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
              _M_realloc_insert<pybind11::handle_const&>
                        ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)local_100,
                         (iterator)local_100._8_8_,(handle *)local_188);
            }
            else {
              *(PyObject **)local_100._8_8_ = (PyObject *)local_188._0_8_;
              local_100._8_8_ = local_100._8_8_ + 8;
            }
            aVar8 = (argument_record)0x1;
            if (bVar28) {
              aVar8 = paVar27[0x18];
            }
            std::vector<bool,_std::allocator<bool>_>::push_back
                      ((vector<bool,_std::allocator<bool>_> *)auStack_e8,(bool)((byte)aVar8 & 1));
            uVar22 = uVar22 + 1;
            lVar17 = lVar17 + 0x20;
          } while (local_b8 != uVar22);
        }
        pfVar11 = local_88;
        local_b0.m_ptr = (PyObject *)local_78;
        if (local_78 != (function_record *)0x0) {
          local_78->name = (char *)((long)&((function_record *)local_78->name)->name + 1);
        }
        uVar22 = local_b8;
        if (local_70 < uVar24) {
          lVar17 = local_b8 << 5;
          bVar28 = false;
          do {
            paVar1 = (pfVar11->args).
                     super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_188._0_8_ = (function_record *)0x0;
            if (((local_78 == (function_record *)0x0) || (*(long *)(paVar1 + lVar17) == 0)) ||
               (local_188._0_8_ = PyDict_GetItemString(local_b0.m_ptr),
               (function_record *)local_188._0_8_ == (function_record *)0x0)) {
              pfVar18 = *(function_record **)(paVar1 + lVar17 + 0x10);
              pfVar25 = (function_record *)local_188._0_8_;
            }
            else {
              if (!bVar28) {
                local_158._0_8_ = PyDict_Copy(local_b0.m_ptr);
                object::operator=((object *)&local_b0,(object *)local_158);
                object::~object((object *)local_158);
              }
              PyDict_DelItemString(local_b0.m_ptr,*(undefined8 *)(paVar1 + lVar17));
              bVar28 = true;
              pfVar18 = (function_record *)local_188._0_8_;
              pfVar25 = (function_record *)local_188._0_8_;
            }
            local_188._0_8_ = pfVar18;
            if ((function_record *)local_188._0_8_ == (function_record *)0x0) goto LAB_00115f92;
            if ((handle *)local_100._8_8_ == local_f0) {
              std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
              _M_realloc_insert<pybind11::handle_const&>
                        ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)local_100,
                         (iterator)local_100._8_8_,(handle *)local_188);
            }
            else {
              ((handle *)local_100._8_8_)->m_ptr = (PyObject *)local_188._0_8_;
              local_100._8_8_ = local_100._8_8_ + 8;
            }
            std::vector<bool,_std::allocator<bool>_>::push_back
                      ((vector<bool,_std::allocator<bool>_> *)auStack_e8,
                       (bool)((byte)paVar1[lVar17 + 0x18] & 1));
            uVar22 = uVar22 + 1;
            lVar17 = lVar17 + 0x20;
          } while (uVar22 < uVar24);
        }
        if ((((function_record *)local_b0.m_ptr == (function_record *)0x0) ||
            (lVar17 = PyDict_Size(), lVar17 == 0)) ||
           (pfVar25 = (function_record *)local_188._0_8_, (pfVar11->field_0x59 & 0x10) != 0)) {
          tuple::tuple((tuple *)&local_160,0);
          bVar21 = pfVar11->field_0x59;
          if ((bVar21 & 8) != 0) {
            if (local_b8 == 0) {
              local_188._0_8_ = local_80;
              local_80->name = (char *)((long)&((function_record *)local_80->name)->name + 1);
LAB_00116093:
              object::operator=((object *)&local_160,(object *)local_188);
              object::~object((object *)local_188);
            }
            else {
              pfVar25 = (function_record *)(local_70 - uVar22);
              if (local_70 < uVar22 || pfVar25 == (function_record *)0x0) {
                tuple::tuple((tuple *)local_188,0);
                goto LAB_00116093;
              }
              tuple::tuple((tuple *)local_188,(size_t)pfVar25);
              object::operator=((object *)&local_160,(object *)local_188);
              object::~object((object *)local_188);
              ppPVar6 = local_48;
              pfVar18 = (function_record *)0x0;
              do {
                if ((((PyTypeObject *)
                     (((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)&local_80->doc
                      )->super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>).
                     _M_impl.super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
                  __assert_fail("PyTuple_Check(args_in)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/shibasisp[P]pybind11-examples/pybind11/include/pybind11/pybind11.h"
                                ,0x21e,
                                "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                               );
                }
                hVar13.m_ptr = (PyObject *)ppPVar6[(long)pfVar18->data + (uVar22 - 0x38)];
                if (hVar13.m_ptr != (PyObject *)0x0) {
                  (hVar13.m_ptr)->ob_refcnt = (hVar13.m_ptr)->ob_refcnt + 1;
                }
                local_188._8_8_ = local_160.m_ptr;
                oStack_170.super_handle.m_ptr = (handle)(PyObject *)0x0;
                local_188._16_8_ = pfVar18;
                detail::accessor_policies::tuple_item::set(local_160,(size_t)pfVar18,hVar13);
                object::~object((object *)(local_188 + 0x18));
                pfVar18 = (function_record *)((long)&pfVar18->name + 1);
              } while (pfVar25 != pfVar18);
            }
            if ((handle *)local_100._8_8_ == local_f0) {
              std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
              _M_realloc_insert<pybind11::handle_const&>
                        ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)local_100,
                         (iterator)local_100._8_8_,&local_160);
            }
            else {
              *(PyObject **)local_100._8_8_ = local_160.m_ptr;
              local_100._8_8_ = local_100._8_8_ + 8;
            }
            std::vector<bool,_std::allocator<bool>_>::push_back
                      ((vector<bool,_std::allocator<bool>_> *)auStack_e8,false);
            bVar21 = pfVar11->field_0x59;
          }
          if ((bVar21 & 0x10) != 0) {
            if ((function_record *)local_b0.m_ptr == (function_record *)0x0) {
              dict::dict((dict *)local_188);
              object::operator=((object *)&local_b0,(object *)local_188);
              object::~object((object *)local_188);
            }
            if ((handle *)local_100._8_8_ == local_f0) {
              std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
              _M_realloc_insert<pybind11::handle_const&>
                        ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)local_100,
                         (iterator)local_100._8_8_,&local_b0);
            }
            else {
              *(PyObject **)local_100._8_8_ = local_b0.m_ptr;
              local_100._8_8_ = local_100._8_8_ + 8;
            }
            std::vector<bool,_std::allocator<bool>_>::push_back
                      ((vector<bool,_std::allocator<bool>_> *)auStack_e8,false);
          }
          __new_size = (long)(local_100._8_8_ - local_100._0_8_) >> 3;
          if ((__new_size != pfVar11->nargs) ||
             (((ulong)hStack_d0.m_ptr & 0xffffffff) + ((long)local_d8.m_ptr - auStack_e8._0_8_) * 8
              != __new_size)) {
            pybind11_fail(
                         "Internal error: function call dispatcher inserted wrong number of arguments!"
                         );
          }
          local_158._0_8_ = (PyObject *)0x0;
          local_158._8_8_ = local_158._8_8_ & 0xffffffff00000000;
          local_148._0_8_ = (function_record *)0x0;
          local_148._8_8_ = local_148._8_8_ & 0xffffffff00000000;
          local_138 = (_Bit_pointer)0x0;
          if (local_50 != (function_record *)0x0) {
            std::vector<bool,_std::allocator<bool>_>::resize
                      ((vector<bool,_std::allocator<bool>_> *)local_158,__new_size,false);
            puVar5 = local_c8;
            hVar4.m_ptr = hStack_d0.m_ptr;
            hVar13.m_ptr = local_d8.m_ptr;
            uVar3 = auStack_e8._8_8_;
            uVar2 = auStack_e8._0_8_;
            local_168 = local_c8;
            local_188._16_8_ = local_d8.m_ptr;
            oStack_170.super_handle.m_ptr = (handle)(handle)hStack_d0.m_ptr;
            local_188._0_8_ = auStack_e8._0_8_;
            local_188._8_8_ = auStack_e8._8_8_;
            local_c8 = local_138;
            local_d8.m_ptr = (PyObject *)local_148._0_8_;
            hStack_d0.m_ptr = (PyObject *)local_148._8_8_;
            auStack_e8._0_8_ = local_158._0_8_;
            auStack_e8._8_8_ = local_158._8_8_;
            local_138 = puVar5;
            local_148._0_8_ = hVar13.m_ptr;
            local_148._8_8_ = hVar4.m_ptr;
            local_158._0_8_ = uVar2;
            local_158._8_8_ = uVar3;
          }
          local_60 = (PyObject *)(*pfVar11->impl)((function_call *)local_108);
          puVar5 = local_c8;
          hVar4.m_ptr = hStack_d0.m_ptr;
          hVar13.m_ptr = local_d8.m_ptr;
          uVar3 = auStack_e8._8_8_;
          uVar2 = auStack_e8._0_8_;
          bVar28 = local_60 != (PyObject *)0x1;
          if (!bVar28 && local_50 != (function_record *)0x0) {
            for (uVar22 = (ulong)((byte)pfVar11->field_0x59 >> 5 & 1); bVar28 = false,
                uVar22 < uVar24; uVar22 = uVar22 + 1) {
              uVar23 = uVar22 + 0x3f;
              if (-1 < (long)uVar22) {
                uVar23 = uVar22;
              }
              if ((*(ulong *)(local_158._0_8_ +
                             (ulong)((uVar22 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                             ((long)uVar23 >> 6) * 8 + -8) >> (uVar22 & 0x3f) & 1) != 0) {
                local_168 = local_c8;
                local_188._16_8_ = local_d8.m_ptr;
                oStack_170.super_handle.m_ptr = (handle)(handle)hStack_d0.m_ptr;
                local_188._0_8_ = auStack_e8._0_8_;
                local_188._8_8_ = auStack_e8._8_8_;
                local_c8 = local_138;
                local_d8.m_ptr = (PyObject *)local_148._0_8_;
                hStack_d0.m_ptr = (PyObject *)local_148._8_8_;
                auStack_e8._0_8_ = local_158._0_8_;
                auStack_e8._8_8_ = local_158._8_8_;
                local_138 = puVar5;
                local_148._0_8_ = hVar13.m_ptr;
                local_148._8_8_ = hVar4.m_ptr;
                local_158._0_8_ = uVar2;
                local_158._8_8_ = uVar3;
                std::
                vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                ::emplace_back<pybind11::detail::function_call>
                          ((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                            *)local_128,(function_call *)local_108);
                bVar28 = false;
                break;
              }
            }
          }
          if ((function_record *)local_158._0_8_ != (function_record *)0x0) {
            operator_delete((void *)local_158._0_8_,(long)local_138 - local_158._0_8_);
          }
          object::~object((object *)&local_160);
        }
        else {
LAB_00115f92:
          local_188._0_8_ = pfVar25;
          bVar28 = false;
        }
        object::~object((object *)&local_b0);
LAB_00116369:
        if ((function_record *)auStack_e8._0_8_ != (function_record *)0x0) {
          operator_delete((void *)auStack_e8._0_8_,(long)local_c8 - auStack_e8._0_8_);
          auStack_e8._0_8_ = (function_record *)0x0;
          auStack_e8._8_8_ = auStack_e8._8_8_ & 0xffffffff00000000;
          local_d8.m_ptr = (PyObject *)0x0;
          hStack_d0.m_ptr = hStack_d0.m_ptr & 0xffffffff00000000;
          local_c8 = (_Bit_pointer)0x0;
        }
        if ((pointer)local_100._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_100._0_8_,(long)local_f0 - local_100._0_8_);
        }
        uVar22 = local_70;
        if (bVar28) break;
      }
      pfVar11 = pfVar11->next;
    } while (pfVar11 != (function_record *)0x0);
    uVar2 = local_128._8_8_;
    if ((local_50 == (function_record *)0x0) || (local_128._0_8_ == local_128._8_8_)) {
      std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
      ::~vector((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                 *)local_128);
      hVar13.m_ptr = local_60;
      if (local_60 == (PyObject *)0x1) goto LAB_001164e4;
    }
    else {
      hVar13.m_ptr = local_60;
      pfVar11 = (function_record *)local_128._0_8_;
      if (local_60 == (PyObject *)0x1) {
        do {
          hVar13 = (*((function_record *)pfVar11->name)->impl)((function_call *)pfVar11);
          if (hVar13.m_ptr != (PyObject *)0x1) goto LAB_0011647c;
          pfVar11 = (function_record *)&pfVar11->free_data;
        } while (pfVar11 != (function_record *)uVar2);
        goto LAB_0011648b;
      }
LAB_0011647c:
      std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
      ::~vector((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                 *)local_128);
    }
    if (hVar13.m_ptr != (PyObject *)0x0) {
      if ((local_90->field_0x59 & 1) != 0) {
        ptVar14 = detail::get_type_info((PyTypeObject *)(local_90->scope).m_ptr);
        (*ptVar14->init_holder)((instance *)local_58,(void *)0x0);
        return hVar13.m_ptr;
      }
      return hVar13.m_ptr;
    }
    local_108 = (undefined1  [8])(local_100 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_108,
               "Unable to convert function return value to a Python type! The signature was\n\t","")
    ;
    std::__cxx11::string::append(local_108);
    PyErr_SetString(_PyExc_TypeError,local_108);
    if (local_108 == (undefined1  [8])(local_100 + 8)) {
      return (PyObject *)0x0;
    }
    goto LAB_00116d76;
  }
LAB_0011648b:
  std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>::
  ~vector((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
           *)local_128);
LAB_001164e4:
  pfVar11 = local_90;
  if ((local_90->field_0x59 & 4) != 0) {
    __Py_NotImplementedStruct = __Py_NotImplementedStruct + 1;
    return (PyObject *)&_Py_NotImplementedStruct;
  }
  std::__cxx11::string::string((string *)local_128,local_90->name,(allocator *)&local_160);
  puVar15 = (undefined8 *)std::__cxx11::string::append(local_128);
  local_158._0_8_ = local_148;
  pfVar25 = (function_record *)(puVar15 + 2);
  if ((function_record *)*puVar15 == pfVar25) {
    local_148._0_8_ = pfVar25->name;
    local_148._8_8_ = puVar15[3];
  }
  else {
    local_148._0_8_ = pfVar25->name;
    local_158._0_8_ = (PyObject *)*puVar15;
  }
  local_158._8_8_ = puVar15[1];
  *puVar15 = pfVar25;
  puVar15[1] = 0;
  *(undefined1 *)(puVar15 + 2) = 0;
  iVar10 = 0x11cd9a;
  if ((pfVar11->field_0x59 & 1) != 0) {
    iVar10 = 0x11cd8e;
  }
  local_b0.m_ptr = &local_a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,iVar10,iVar10 + ((byte)pfVar11->field_0x59 & 1) * 3 + 8);
  pfVar11 = (function_record *)((long)(function_record **)local_158._8_8_ + local_a8);
  pfVar25 = (function_record *)0xf;
  if ((function_record *)local_158._0_8_ != (function_record *)local_148) {
    pfVar25 = (function_record *)local_148._0_8_;
  }
  if (pfVar25 < pfVar11) {
    pfVar25 = (function_record *)0xf;
    if (local_b0.m_ptr != &local_a0) {
      pfVar25 = (function_record *)local_a0.ob_refcnt;
    }
    if (pfVar25 < pfVar11) goto LAB_00116662;
    puVar15 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,local_158._0_8_);
  }
  else {
LAB_00116662:
    puVar15 = (undefined8 *)std::__cxx11::string::_M_append(local_158,(ulong)local_b0.m_ptr);
  }
  local_188._0_8_ = local_188 + 0x10;
  pfVar11 = (function_record *)(puVar15 + 2);
  if ((function_record *)*puVar15 == pfVar11) {
    local_188._16_8_ = pfVar11->name;
    oStack_170.super_handle.m_ptr = (handle)puVar15[3];
  }
  else {
    local_188._16_8_ = pfVar11->name;
    local_188._0_8_ = (function_record *)*puVar15;
  }
  local_188._8_8_ = puVar15[1];
  *puVar15 = pfVar11;
  puVar15[1] = 0;
  *(undefined1 *)&pfVar11->name = 0;
  plVar16 = (long *)std::__cxx11::string::append(local_188);
  local_108 = (undefined1  [8])(local_100 + 8);
  pfVar11 = (function_record *)(plVar16 + 2);
  if ((function_record *)*plVar16 == pfVar11) {
    local_100._8_8_ = pfVar11->name;
    local_f0 = (handle *)plVar16[3];
  }
  else {
    local_100._8_8_ = pfVar11->name;
    local_108 = (undefined1  [8])*plVar16;
  }
  local_100._0_8_ = plVar16[1];
  *plVar16 = (long)pfVar11;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  if ((function_record *)local_188._0_8_ != (function_record *)(local_188 + 0x10)) {
    operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
  }
  if (local_b0.m_ptr != &local_a0) {
    operator_delete(local_b0.m_ptr,(ulong)((long)(char **)local_a0.ob_refcnt + 1));
  }
  if ((function_record *)local_158._0_8_ != (function_record *)local_148) {
    operator_delete((void *)local_158._0_8_,(ulong)(local_148._0_8_ + 1));
  }
  if ((function_record *)local_128._0_8_ != (function_record *)(local_128 + 0x10)) {
    operator_delete((void *)local_128._0_8_,(ulong)((long)(function_record **)local_128._16_8_ + 1))
    ;
  }
  pfVar11 = local_90;
  uVar26 = 0;
  do {
    __val = uVar26 + 1;
    __len = 1;
    if (8 < uVar26) {
      uVar22 = (ulong)__val;
      uVar26 = 4;
      do {
        __len = uVar26;
        uVar9 = (uint)uVar22;
        if (uVar9 < 100) {
          __len = __len - 2;
          goto LAB_00116800;
        }
        if (uVar9 < 1000) {
          __len = __len - 1;
          goto LAB_00116800;
        }
        if (uVar9 < 10000) goto LAB_00116800;
        uVar22 = uVar22 / 10000;
        uVar26 = __len + 4;
      } while (99999 < uVar9);
      __len = __len + 1;
    }
LAB_00116800:
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_128,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_128._0_8_,__len,__val);
    puVar15 = (undefined8 *)std::__cxx11::string::replace((ulong)local_128,0,(char *)0x0,0x11cddc);
    local_158._0_8_ = local_148;
    pfVar25 = (function_record *)(puVar15 + 2);
    if ((function_record *)*puVar15 == pfVar25) {
      local_148._0_8_ = pfVar25->name;
      local_148._8_8_ = puVar15[3];
    }
    else {
      local_148._0_8_ = pfVar25->name;
      local_158._0_8_ = (PyObject *)*puVar15;
    }
    local_158._8_8_ = puVar15[1];
    *puVar15 = pfVar25;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    puVar15 = (undefined8 *)std::__cxx11::string::append(local_158);
    local_188._0_8_ = local_188 + 0x10;
    pfVar25 = (function_record *)(puVar15 + 2);
    if ((function_record *)*puVar15 == pfVar25) {
      local_188._16_8_ = pfVar25->name;
      oStack_170.super_handle.m_ptr = (handle)puVar15[3];
    }
    else {
      local_188._16_8_ = pfVar25->name;
      local_188._0_8_ = (function_record *)*puVar15;
    }
    local_188._8_8_ = puVar15[1];
    *puVar15 = pfVar25;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_108,local_188._0_8_);
    if ((function_record *)local_188._0_8_ != (function_record *)(local_188 + 0x10)) {
      operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
    }
    if ((function_record *)local_158._0_8_ != (function_record *)local_148) {
      operator_delete((void *)local_158._0_8_,(ulong)(local_148._0_8_ + 1));
    }
    if ((function_record *)local_128._0_8_ != (function_record *)(local_128 + 0x10)) {
      operator_delete((void *)local_128._0_8_,
                      (ulong)((long)(function_record **)local_128._16_8_ + 1));
    }
    if ((local_90->field_0x59 & 1) == 0) {
LAB_00116a73:
      std::__cxx11::string::append((char *)local_108);
    }
    else {
      std::__cxx11::string::string((string *)local_188,pfVar11->signature,(allocator *)local_158);
      lVar17 = std::__cxx11::string::find((char)local_188,0x28);
      pfVar25 = (function_record *)(lVar17 + 7);
      if ((ulong)local_188._8_8_ <= pfVar25) {
LAB_00116a58:
        if ((function_record *)local_188._0_8_ != (function_record *)(local_188 + 0x10)) {
          operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
        }
        goto LAB_00116a73;
      }
      pfVar18 = (function_record *)std::__cxx11::string::find(local_188,0x11cde1,0);
      local_b8 = std::__cxx11::string::rfind(local_188,0x11cde4,0xffffffffffffffff);
      if (pfVar18 < (ulong)local_188._8_8_) {
        pfVar19 = (function_record *)((long)&pfVar18->name + 2);
      }
      else {
        pfVar19 = (function_record *)std::__cxx11::string::find((char)local_188,0x29);
        pfVar18 = pfVar19;
      }
      if ((pfVar18 <= pfVar25) || ((ulong)local_188._8_8_ <= pfVar19)) goto LAB_00116a58;
      std::__cxx11::string::append((string *)local_108,(ulong)local_188,(ulong)pfVar25);
      std::__cxx11::string::push_back((char)(string *)local_108);
      std::__cxx11::string::append((string *)local_108,(ulong)local_188,(ulong)pfVar19);
      if ((function_record *)local_188._0_8_ != (function_record *)(local_188 + 0x10)) {
        operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
      }
    }
    std::__cxx11::string::append((char *)local_108);
    pfVar11 = pfVar11->next;
    uVar26 = __val;
  } while (pfVar11 != (function_record *)0x0);
  std::__cxx11::string::append(local_108);
  local_b0.m_ptr = (PyObject *)local_80;
  if (local_80 != (function_record *)0x0) {
    local_80->name = (char *)((long)&((function_record *)local_80->name)->name + 1);
  }
  bVar28 = false;
  for (pfVar11 = (function_record *)(ulong)((byte)local_90->field_0x59 & 1);
      pfVar25 = (function_record *)PyTuple_Size(local_b0.m_ptr), pfVar11 < pfVar25;
      pfVar11 = (function_record *)((long)&pfVar11->name + 1)) {
    bVar7 = true;
    if (bVar28) {
      std::__cxx11::string::append(local_108);
      bVar7 = bVar28;
    }
    bVar28 = bVar7;
    local_158._8_8_ = local_b0.m_ptr;
    local_148._8_8_ = (PyObject *)0x0;
    local_148._0_8_ = pfVar11;
    poVar20 = detail::accessor<pybind11::detail::accessor_policies::tuple_item>::get_cache
                        ((accessor<pybind11::detail::accessor_policies::tuple_item> *)local_158);
    local_160.m_ptr = (poVar20->super_handle).m_ptr;
    if ((function_record *)local_160.m_ptr != (function_record *)0x0) {
      ((function_record *)local_160.m_ptr)->name =
           (char *)((long)&((function_record *)((function_record *)local_160.m_ptr)->name)->name + 1
                   );
    }
    hVar13.m_ptr = (PyObject *)PyObject_Repr(local_160.m_ptr);
    if ((function_record *)hVar13.m_ptr == (function_record *)0x0) {
      this = (error_already_set *)__cxa_allocate_exception(0x28);
      error_already_set::error_already_set(this);
      __cxa_throw(this,&error_already_set::typeinfo,error_already_set::~error_already_set);
    }
    local_128._0_8_ = hVar13.m_ptr;
    str::operator_cast_to_string((string *)local_188,(str *)local_128);
    std::__cxx11::string::_M_append(local_108,local_188._0_8_);
    if ((function_record *)local_188._0_8_ != (function_record *)(local_188 + 0x10)) {
      operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
    }
    object::~object((object *)local_128);
    object::~object((object *)&local_160);
    object::~object((object *)(local_148 + 8));
  }
  if (local_78 != (function_record *)0x0) {
    local_160.m_ptr = (PyObject *)local_78;
    local_78->name = (char *)((long)&((function_record *)local_78->name)->name + 1);
    lVar17 = PyDict_Size();
    if (lVar17 != 0) {
      if (bVar28) {
        std::__cxx11::string::append(local_108);
      }
      std::__cxx11::string::append(local_108);
      local_188._0_8_ = local_160.m_ptr;
      oStack_170.super_handle.m_ptr = (handle)(PyObject *)0x0;
      iVar10 = PyDict_Next(local_160.m_ptr,local_188 + 0x18,local_188 + 8,local_188 + 0x10);
      if ((iVar10 != 0) && (oStack_170.super_handle.m_ptr != (PyObject *)0xffffffffffffffff)) {
        local_128._0_8_ = local_188._8_8_;
        local_128._8_8_ = local_188._16_8_;
        while( true ) {
          str::str((str *)&local_40,"{}={!r}");
          str::format<pybind11::handle&,pybind11::handle&>
                    ((str *)&local_38,&local_40,(handle *)local_128);
          str::operator_cast_to_string((string *)local_158,(str *)&local_38);
          std::__cxx11::string::_M_append(local_108,local_158._0_8_);
          if ((PyObject *)local_158._0_8_ != (PyObject *)local_148) {
            operator_delete((void *)local_158._0_8_,(ulong)(local_148._0_8_ + 1));
          }
          object::~object(&local_38);
          object::~object((object *)&local_40);
          iVar10 = PyDict_Next(local_188._0_8_,local_188 + 0x18,local_188 + 8,local_188 + 0x10);
          if ((iVar10 == 0) || (oStack_170.super_handle.m_ptr == (PyObject *)0xffffffffffffffff))
          break;
          local_128._0_8_ = local_188._8_8_;
          local_128._8_8_ = local_188._16_8_;
          std::__cxx11::string::append(local_108);
        }
      }
    }
    object::~object((object *)&local_160);
  }
  PyErr_SetString(_PyExc_TypeError,local_108);
  object::~object((object *)&local_b0);
  if (local_108 == (undefined1  [8])(local_100 + 8)) {
    return (PyObject *)0x0;
  }
LAB_00116d76:
  operator_delete((void *)local_108,(ulong)((long)(PyObject **)local_100._8_8_ + 1));
  return (PyObject *)0x0;
}

Assistant:

static PyObject *dispatcher(PyObject *self, PyObject *args_in, PyObject *kwargs_in) {
        using namespace detail;

        /* Iterator over the list of potentially admissible overloads */
        function_record *overloads = (function_record *) PyCapsule_GetPointer(self, nullptr),
                        *it = overloads;

        /* Need to know how many arguments + keyword arguments there are to pick the right overload */
        const size_t n_args_in = (size_t) PyTuple_GET_SIZE(args_in);

        handle parent = n_args_in > 0 ? PyTuple_GET_ITEM(args_in, 0) : nullptr,
               result = PYBIND11_TRY_NEXT_OVERLOAD;

        try {
            // We do this in two passes: in the first pass, we load arguments with `convert=false`;
            // in the second, we allow conversion (except for arguments with an explicit
            // py::arg().noconvert()).  This lets us prefer calls without conversion, with
            // conversion as a fallback.
            std::vector<function_call> second_pass;

            // However, if there are no overloads, we can just skip the no-convert pass entirely
            const bool overloaded = it != nullptr && it->next != nullptr;

            for (; it != nullptr; it = it->next) {

                /* For each overload:
                   1. Copy all positional arguments we were given, also checking to make sure that
                      named positional arguments weren't *also* specified via kwarg.
                   2. If we weren't given enough, try to make up the omitted ones by checking
                      whether they were provided by a kwarg matching the `py::arg("name")` name.  If
                      so, use it (and remove it from kwargs; if not, see if the function binding
                      provided a default that we can use.
                   3. Ensure that either all keyword arguments were "consumed", or that the function
                      takes a kwargs argument to accept unconsumed kwargs.
                   4. Any positional arguments still left get put into a tuple (for args), and any
                      leftover kwargs get put into a dict.
                   5. Pack everything into a vector; if we have py::args or py::kwargs, they are an
                      extra tuple or dict at the end of the positional arguments.
                   6. Call the function call dispatcher (function_record::impl)

                   If one of these fail, move on to the next overload and keep trying until we get a
                   result other than PYBIND11_TRY_NEXT_OVERLOAD.
                 */

                function_record &func = *it;
                size_t pos_args = func.nargs;    // Number of positional arguments that we need
                if (func.has_args) --pos_args;   // (but don't count py::args
                if (func.has_kwargs) --pos_args; //  or py::kwargs)

                if (!func.has_args && n_args_in > pos_args)
                    continue; // Too many arguments for this overload

                if (n_args_in < pos_args && func.args.size() < pos_args)
                    continue; // Not enough arguments given, and not enough defaults to fill in the blanks

                function_call call(func, parent);

                size_t args_to_copy = std::min(pos_args, n_args_in);
                size_t args_copied = 0;

                // 1. Copy any position arguments given.
                bool bad_arg = false;
                for (; args_copied < args_to_copy; ++args_copied) {
                    argument_record *arg_rec = args_copied < func.args.size() ? &func.args[args_copied] : nullptr;
                    if (kwargs_in && arg_rec && arg_rec->name && PyDict_GetItemString(kwargs_in, arg_rec->name)) {
                        bad_arg = true;
                        break;
                    }

                    handle arg(PyTuple_GET_ITEM(args_in, args_copied));
                    if (arg_rec && !arg_rec->none && arg.is_none()) {
                        bad_arg = true;
                        break;
                    }
                    call.args.push_back(arg);
                    call.args_convert.push_back(arg_rec ? arg_rec->convert : true);
                }
                if (bad_arg)
                    continue; // Maybe it was meant for another overload (issue #688)

                // We'll need to copy this if we steal some kwargs for defaults
                dict kwargs = reinterpret_borrow<dict>(kwargs_in);

                // 2. Check kwargs and, failing that, defaults that may help complete the list
                if (args_copied < pos_args) {
                    bool copied_kwargs = false;

                    for (; args_copied < pos_args; ++args_copied) {
                        const auto &arg = func.args[args_copied];

                        handle value;
                        if (kwargs_in && arg.name)
                            value = PyDict_GetItemString(kwargs.ptr(), arg.name);

                        if (value) {
                            // Consume a kwargs value
                            if (!copied_kwargs) {
                                kwargs = reinterpret_steal<dict>(PyDict_Copy(kwargs.ptr()));
                                copied_kwargs = true;
                            }
                            PyDict_DelItemString(kwargs.ptr(), arg.name);
                        } else if (arg.value) {
                            value = arg.value;
                        }

                        if (value) {
                            call.args.push_back(value);
                            call.args_convert.push_back(arg.convert);
                        }
                        else
                            break;
                    }

                    if (args_copied < pos_args)
                        continue; // Not enough arguments, defaults, or kwargs to fill the positional arguments
                }

                // 3. Check everything was consumed (unless we have a kwargs arg)
                if (kwargs && kwargs.size() > 0 && !func.has_kwargs)
                    continue; // Unconsumed kwargs, but no py::kwargs argument to accept them

                // 4a. If we have a py::args argument, create a new tuple with leftovers
                tuple extra_args;
                if (func.has_args) {
                    if (args_to_copy == 0) {
                        // We didn't copy out any position arguments from the args_in tuple, so we
                        // can reuse it directly without copying:
                        extra_args = reinterpret_borrow<tuple>(args_in);
                    } else if (args_copied >= n_args_in) {
                        extra_args = tuple(0);
                    } else {
                        size_t args_size = n_args_in - args_copied;
                        extra_args = tuple(args_size);
                        for (size_t i = 0; i < args_size; ++i) {
                            handle item = PyTuple_GET_ITEM(args_in, args_copied + i);
                            extra_args[i] = item.inc_ref().ptr();
                        }
                    }
                    call.args.push_back(extra_args);
                    call.args_convert.push_back(false);
                }

                // 4b. If we have a py::kwargs, pass on any remaining kwargs
                if (func.has_kwargs) {
                    if (!kwargs.ptr())
                        kwargs = dict(); // If we didn't get one, send an empty one
                    call.args.push_back(kwargs);
                    call.args_convert.push_back(false);
                }

                // 5. Put everything in a vector.  Not technically step 5, we've been building it
                // in `call.args` all along.
                #if !defined(NDEBUG)
                if (call.args.size() != func.nargs || call.args_convert.size() != func.nargs)
                    pybind11_fail("Internal error: function call dispatcher inserted wrong number of arguments!");
                #endif

                std::vector<bool> second_pass_convert;
                if (overloaded) {
                    // We're in the first no-convert pass, so swap out the conversion flags for a
                    // set of all-false flags.  If the call fails, we'll swap the flags back in for
                    // the conversion-allowed call below.
                    second_pass_convert.resize(func.nargs, false);
                    call.args_convert.swap(second_pass_convert);
                }

                // 6. Call the function.
                try {
                    result = func.impl(call);
                } catch (reference_cast_error &) {
                    result = PYBIND11_TRY_NEXT_OVERLOAD;
                }

                if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD)
                    break;

                if (overloaded) {
                    // The (overloaded) call failed; if the call has at least one argument that
                    // permits conversion (i.e. it hasn't been explicitly specified `.noconvert()`)
                    // then add this call to the list of second pass overloads to try.
                    for (size_t i = func.is_method ? 1 : 0; i < pos_args; i++) {
                        if (second_pass_convert[i]) {
                            // Found one: swap the converting flags back in and store the call for
                            // the second pass.
                            call.args_convert.swap(second_pass_convert);
                            second_pass.push_back(std::move(call));
                            break;
                        }
                    }
                }
            }

            if (overloaded && !second_pass.empty() && result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
                // The no-conversion pass finished without success, try again with conversion allowed
                for (auto &call : second_pass) {
                    try {
                        result = call.func.impl(call);
                    } catch (reference_cast_error &) {
                        result = PYBIND11_TRY_NEXT_OVERLOAD;
                    }

                    if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD)
                        break;
                }
            }
        } catch (error_already_set &e) {
            e.restore();
            return nullptr;
        } catch (...) {
            /* When an exception is caught, give each registered exception
               translator a chance to translate it to a Python exception
               in reverse order of registration.

               A translator may choose to do one of the following:

                - catch the exception and call PyErr_SetString or PyErr_SetObject
                  to set a standard (or custom) Python exception, or
                - do nothing and let the exception fall through to the next translator, or
                - delegate translation to the next translator by throwing a new type of exception. */

            auto last_exception = std::current_exception();
            auto &registered_exception_translators = get_internals().registered_exception_translators;
            for (auto& translator : registered_exception_translators) {
                try {
                    translator(last_exception);
                } catch (...) {
                    last_exception = std::current_exception();
                    continue;
                }
                return nullptr;
            }
            PyErr_SetString(PyExc_SystemError, "Exception escaped from default exception translator!");
            return nullptr;
        }

        if (result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
            if (overloads->is_operator)
                return handle(Py_NotImplemented).inc_ref().ptr();

            std::string msg = std::string(overloads->name) + "(): incompatible " +
                std::string(overloads->is_constructor ? "constructor" : "function") +
                " arguments. The following argument types are supported:\n";

            int ctr = 0;
            for (function_record *it2 = overloads; it2 != nullptr; it2 = it2->next) {
                msg += "    "+ std::to_string(++ctr) + ". ";

                bool wrote_sig = false;
                if (overloads->is_constructor) {
                    // For a constructor, rewrite `(self: Object, arg0, ...) -> NoneType` as `Object(arg0, ...)`
                    std::string sig = it2->signature;
                    size_t start = sig.find('(') + 7; // skip "(self: "
                    if (start < sig.size()) {
                        // End at the , for the next argument
                        size_t end = sig.find(", "), next = end + 2;
                        size_t ret = sig.rfind(" -> ");
                        // Or the ), if there is no comma:
                        if (end >= sig.size()) next = end = sig.find(')');
                        if (start < end && next < sig.size()) {
                            msg.append(sig, start, end - start);
                            msg += '(';
                            msg.append(sig, next, ret - next);
                            wrote_sig = true;
                        }
                    }
                }
                if (!wrote_sig) msg += it2->signature;

                msg += "\n";
            }
            msg += "\nInvoked with: ";
            auto args_ = reinterpret_borrow<tuple>(args_in);
            bool some_args = false;
            for (size_t ti = overloads->is_constructor ? 1 : 0; ti < args_.size(); ++ti) {
                if (!some_args) some_args = true;
                else msg += ", ";
                msg += pybind11::repr(args_[ti]);
            }
            if (kwargs_in) {
                auto kwargs = reinterpret_borrow<dict>(kwargs_in);
                if (kwargs.size() > 0) {
                    if (some_args) msg += "; ";
                    msg += "kwargs: ";
                    bool first = true;
                    for (auto kwarg : kwargs) {
                        if (first) first = false;
                        else msg += ", ";
                        msg += pybind11::str("{}={!r}").format(kwarg.first, kwarg.second);
                    }
                }
            }

            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else if (!result) {
            std::string msg = "Unable to convert function return value to a "
                              "Python type! The signature was\n\t";
            msg += it->signature;
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else {
            if (overloads->is_constructor) {
                auto tinfo = get_type_info((PyTypeObject *) overloads->scope.ptr());
                tinfo->init_holder(reinterpret_cast<instance *>(parent.ptr()), nullptr);
            }
            return result.ptr();
        }
    }